

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

void opj_j2k_destroy(opj_j2k_t *p_j2k)

{
  void *ptr;
  uint uVar1;
  int iVar2;
  OPJ_BYTE *pOVar3;
  opj_ppx *ptr_00;
  OPJ_BYTE **ppOVar4;
  opj_tcp_t *poVar5;
  long lVar6;
  ulong uVar7;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    return;
  }
  if (p_j2k->m_is_decoder == 0) {
    pOVar3 = (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data;
    if (pOVar3 != (OPJ_BYTE *)0x0) {
      opj_free(pOVar3);
      (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = (OPJ_BYTE *)0x0;
    }
    pOVar3 = (p_j2k->m_specific_param).m_decoder.m_header_data;
    if (pOVar3 != (OPJ_BYTE *)0x0) {
      opj_free(pOVar3);
      (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
      (p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_current = (OPJ_BYTE *)0x0;
    }
    pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    if (pOVar3 == (OPJ_BYTE *)0x0) goto LAB_0010ae45;
    ppOVar4 = &(p_j2k->m_specific_param).m_encoder.m_header_tile_data;
    lVar6 = 0x48;
  }
  else {
    poVar5 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    if (poVar5 != (opj_tcp_t *)0x0) {
      opj_j2k_tcp_destroy(poVar5);
      opj_free((p_j2k->m_specific_param).m_decoder.m_default_tcp);
      (p_j2k->m_specific_param).m_decoder.m_default_tcp = (opj_tcp_t *)0x0;
    }
    pOVar3 = (p_j2k->m_specific_param).m_decoder.m_header_data;
    if (pOVar3 == (OPJ_BYTE *)0x0) goto LAB_0010ae45;
    ppOVar4 = &(p_j2k->m_specific_param).m_decoder.m_header_data;
    lVar6 = 0x20;
  }
  opj_free(pOVar3);
  *ppOVar4 = (OPJ_BYTE *)0x0;
  *(undefined4 *)((long)&p_j2k->m_is_decoder + lVar6) = 0;
LAB_0010ae45:
  opj_tcd_destroy(p_j2k->m_tcd);
  poVar5 = (p_j2k->m_cp).tcps;
  if (poVar5 != (opj_tcp_t *)0x0) {
    iVar2 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
    if (iVar2 != 0) {
      do {
        opj_j2k_tcp_destroy(poVar5);
        poVar5 = poVar5 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      poVar5 = (p_j2k->m_cp).tcps;
    }
    opj_free(poVar5);
    (p_j2k->m_cp).tcps = (opj_tcp_t *)0x0;
  }
  ptr_00 = (p_j2k->m_cp).ppm_markers;
  if (ptr_00 != (opj_ppx *)0x0) {
    uVar1 = (p_j2k->m_cp).ppm_markers_count;
    if (uVar1 != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        ptr = *(void **)((long)&((p_j2k->m_cp).ppm_markers)->m_data + lVar6);
        if (ptr != (void *)0x0) {
          opj_free(ptr);
          uVar1 = (p_j2k->m_cp).ppm_markers_count;
        }
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar7 < uVar1);
      ptr_00 = (p_j2k->m_cp).ppm_markers;
    }
    (p_j2k->m_cp).ppm_markers_count = 0;
    opj_free(ptr_00);
    (p_j2k->m_cp).ppm_markers = (opj_ppx *)0x0;
  }
  opj_free((p_j2k->m_cp).ppm_buffer);
  (p_j2k->m_cp).ppm_buffer = (OPJ_BYTE *)0x0;
  (p_j2k->m_cp).ppm_data = (OPJ_BYTE *)0x0;
  opj_free((p_j2k->m_cp).comment);
  (p_j2k->m_cp).comment = (OPJ_CHAR *)0x0;
  if (((p_j2k->m_cp).field_0x90 & 2) == 0) {
    opj_free((p_j2k->m_cp).m_specific_param.m_enc.m_matrice);
  }
  memset(&p_j2k->m_cp,0,0x98);
  opj_procedure_list_destroy(p_j2k->m_procedure_list);
  p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
  opj_procedure_list_destroy(p_j2k->m_validation_list);
  p_j2k->m_procedure_list = (opj_procedure_list_t *)0x0;
  j2k_destroy_cstr_index(p_j2k->cstr_index);
  p_j2k->cstr_index = (opj_codestream_index_t *)0x0;
  opj_image_destroy(p_j2k->m_private_image);
  p_j2k->m_private_image = (opj_image_t *)0x0;
  opj_image_destroy(p_j2k->m_output_image);
  p_j2k->m_output_image = (opj_image_t *)0x0;
  opj_free(p_j2k);
  return;
}

Assistant:

void opj_j2k_destroy (opj_j2k_t *p_j2k)
{
        if (p_j2k == 00) {
                return;
        }

        if (p_j2k->m_is_decoder) {

                if (p_j2k->m_specific_param.m_decoder.m_default_tcp != 00) {
                        opj_j2k_tcp_destroy(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        opj_free(p_j2k->m_specific_param.m_decoder.m_default_tcp);
                        p_j2k->m_specific_param.m_decoder.m_default_tcp = 00;
                }

                if (p_j2k->m_specific_param.m_decoder.m_header_data != 00) {
                        opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                        p_j2k->m_specific_param.m_decoder.m_header_data = 00;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                }
        }
        else {

                if (p_j2k->m_specific_param.m_encoder.m_encoded_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_encoded_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_encoded_tile_data = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer);
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer = 00;
                        p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_current = 00;
                }

                if (p_j2k->m_specific_param.m_encoder.m_header_tile_data) {
                        opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data = 00;
                        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
                }
        }

        opj_tcd_destroy(p_j2k->m_tcd);

        opj_j2k_cp_destroy(&(p_j2k->m_cp));
        memset(&(p_j2k->m_cp),0,sizeof(opj_cp_t));

        opj_procedure_list_destroy(p_j2k->m_procedure_list);
        p_j2k->m_procedure_list = 00;

        opj_procedure_list_destroy(p_j2k->m_validation_list);
        p_j2k->m_procedure_list = 00;

        j2k_destroy_cstr_index(p_j2k->cstr_index);
        p_j2k->cstr_index = NULL;

        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = NULL;

        opj_image_destroy(p_j2k->m_output_image);
        p_j2k->m_output_image = NULL;

        opj_free(p_j2k);
}